

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liblocate.c
# Opt level: O3

void getModulePath(char **path,uint *pathLength)

{
  uchar uVar1;
  uint executablePathDirectoryLength;
  uint executablePathLength;
  char *executablePath;
  uint local_40;
  uint local_3c;
  char *local_38;
  
  uVar1 = checkStringOutParameter(path,pathLength);
  if (uVar1 != '\0') {
    local_38 = (char *)0x0;
    local_3c = 0;
    getExecutablePath(&local_38,&local_3c);
    local_40 = 0;
    getDirectoryPart(local_38,local_3c,&local_40);
    copyToStringOutParameter(local_38,local_40,path,pathLength);
    free(local_38);
  }
  return;
}

Assistant:

void getModulePath(char ** path, unsigned int * pathLength)
{
    // Early exit when invalid out-parameters are passed
    if (!checkStringOutParameter(path, pathLength))
    {
        return;
    }

    char * executablePath = 0x0;
    unsigned int executablePathLength = 0;
    getExecutablePath(&executablePath, &executablePathLength);
    unsigned int executablePathDirectoryLength = 0;

    getDirectoryPart(executablePath, executablePathLength, &executablePathDirectoryLength);

    copyToStringOutParameter(executablePath, executablePathDirectoryLength, path, pathLength);

    free(executablePath);
}